

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_mdef_convert.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bin_mdef_t *pbVar2;
  char *filename;
  char *pcVar3;
  char *__format;
  
  if (argc - 5U < 0xfffffffe) {
LAB_00103526:
    __format = "Usage: %s [-text | -bin] INPUT OUTPUT\n";
    filename = *argv;
  }
  else {
    pcVar3 = argv[1];
    if (*pcVar3 == '-') {
      iVar1 = strcmp(pcVar3,"-text");
      if (iVar1 == 0) {
        filename = argv[2];
        pcVar3 = argv[3];
        pbVar2 = bin_mdef_read((ps_config_t *)0x0,filename);
        if (pbVar2 == (bin_mdef_t *)0x0) {
          __format = "Failed to read binary mdef from %s\n";
        }
        else {
          iVar1 = bin_mdef_write_text(pbVar2,pcVar3);
          if (-1 < iVar1) {
            return 0;
          }
          __format = "Failed to write text mdef to %s\n";
          filename = pcVar3;
        }
        goto LAB_00103546;
      }
      iVar1 = strcmp(pcVar3,"-bin");
      if (iVar1 != 0) {
        fprintf(_stderr,"Unknown argument %s\n",pcVar3);
        goto LAB_00103526;
      }
      pcVar3 = argv[2];
      argv = argv + 1;
    }
    filename = argv[2];
    pbVar2 = bin_mdef_read_text((ps_config_t *)0x0,pcVar3);
    if (pbVar2 == (bin_mdef_t *)0x0) {
      __format = "Failed to read text mdef from %s\n";
      filename = pcVar3;
    }
    else {
      iVar1 = bin_mdef_write(pbVar2,filename);
      if (-1 < iVar1) {
        return 0;
      }
      __format = "Failed to write binary mdef to %s\n";
    }
  }
LAB_00103546:
  fprintf(_stderr,__format,filename);
  return 1;
}

Assistant:

int
main(int argc, char *argv[])
{
    const char *infile, *outfile;
    bin_mdef_t *bin;
    int tobin = 1;

    if (argc < 3 || argc > 4) {
        fprintf(stderr, "Usage: %s [-text | -bin] INPUT OUTPUT\n",
                argv[0]);
        return 1;
    }
    if (argv[1][0] == '-') {
        if (strcmp(argv[1], "-text") == 0) {
            tobin = 0;
            ++argv;
        }
        else if (strcmp(argv[1], "-bin") == 0) {
            tobin = 1;
            ++argv;
        }
        else {
            fprintf(stderr, "Unknown argument %s\n", argv[1]);
            fprintf(stderr, "Usage: %s [-text | -bin] INPUT OUTPUT\n",
                    argv[0]);
            return 1;
        }
    }
    infile = argv[1];
    outfile = argv[2];

    if (tobin) {
        if ((bin = bin_mdef_read_text(NULL, infile)) == NULL) {
            fprintf(stderr, "Failed to read text mdef from %s\n", infile);
            return 1;
        }
        if (bin_mdef_write(bin, outfile) < 0) {
            fprintf(stderr, "Failed to write binary mdef to %s\n",
                    outfile);
            return 1;
        }
    }
    else {
        if ((bin = bin_mdef_read(NULL, infile)) == NULL) {
            fprintf(stderr, "Failed to read binary mdef from %s\n",
                    infile);
            return 1;
        }
        if (bin_mdef_write_text(bin, outfile) < 0) {
            fprintf(stderr, "Failed to write text mdef to %s\n", outfile);
            return 1;
        }
    }

    return 0;
}